

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contract_light_test.cpp
# Opt level: O0

void __thiscall
ContractTestOnClassWithInvariant_ThatWhenNoFunctionWasCalledNoConditionAndInvariantWasCalled_Test::
TestBody(ContractTestOnClassWithInvariant_ThatWhenNoFunctionWasCalledNoConditionAndInvariantWasCalled_Test
         *this)

{
  bool bVar1;
  undefined8 in_RDI;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  undefined7 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffeff;
  AssertionResult *in_stack_ffffffffffffff00;
  AssertionResult *this_00;
  undefined7 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0f;
  char *in_stack_ffffffffffffff10;
  AssertionResult *this_01;
  undefined4 in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  int line;
  char *in_stack_ffffffffffffff20;
  Type type;
  AssertionResult *this_02;
  string local_c0 [32];
  char *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff70;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff78;
  AssertHelper *in_stack_ffffffffffffff80;
  AssertionResult local_50 [3];
  undefined4 local_1c;
  AssertionResult local_18;
  
  type = (Type)((ulong)in_RDI >> 0x20);
  local_1c = 0;
  this_02 = &local_18;
  testing::internal::EqHelper<true>::Compare<int,int>
            ((char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
             in_stack_ffffffffffffff10,
             (int *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
             (int *)in_stack_ffffffffffffff00,
             (type *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_02);
  if (!bVar1) {
    testing::Message::Message((Message *)this_02);
    in_stack_ffffffffffffff20 =
         testing::AssertionResult::failure_message((AssertionResult *)0x13eb6c);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_02,type,in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,
               in_stack_ffffffffffffff10);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffff80,(Message *)in_stack_ffffffffffffff78.ptr_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffff00);
    testing::Message::~Message((Message *)0x13ebc9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13ec1e);
  this_01 = local_50;
  testing::AssertionResult::AssertionResult
            (in_stack_ffffffffffffff00,(bool)in_stack_fffffffffffffeff);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_01);
  line = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff1c);
  if (!bVar1) {
    testing::Message::Message((Message *)this_02);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_ffffffffffffff78.ptr_,in_stack_ffffffffffffff70,
               in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_02,type,in_stack_ffffffffffffff20,line,&this_01->success_);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffff80,(Message *)in_stack_ffffffffffffff78.ptr_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffff00);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
    testing::Message::~Message((Message *)0x13ed33);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13edab);
  this_00 = (AssertionResult *)&stack0xffffffffffffff70;
  testing::AssertionResult::AssertionResult(this_00,(bool)in_stack_fffffffffffffeff);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (!bVar1) {
    testing::Message::Message((Message *)this_02);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_ffffffffffffff78.ptr_,in_stack_ffffffffffffff70,
               in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_02,type,in_stack_ffffffffffffff20,line,&this_01->success_);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffff80,(Message *)in_stack_ffffffffffffff78.ptr_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
    std::__cxx11::string::~string(local_c0);
    testing::Message::~Message((Message *)0x13ee9f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13ef0b);
  return;
}

Assistant:

TEST_F(ContractTestOnClassWithInvariant, ThatWhenNoFunctionWasCalledNoConditionAndInvariantWasCalled)
{
  EXPECT_EQ(0, sut.invariantWasCalled);
  EXPECT_FALSE(sut.preConditionWasCalled);
  EXPECT_FALSE(sut.postConditionWasCalled);
}